

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csharp_field_base.cc
# Opt level: O2

string * __thiscall
google::protobuf::compiler::csharp::FieldGeneratorBase::default_value_abi_cxx11_
          (string *__return_storage_ptr__,FieldGeneratorBase *this,FieldDescriptor *descriptor)

{
  float f;
  double f_00;
  ushort *puVar1;
  bool bVar2;
  Descriptor *this_00;
  EnumValueDescriptor *pEVar3;
  AlphaNum *extraout_RDX;
  AlphaNum *extraout_RDX_00;
  AlphaNum *pAVar4;
  EnumDescriptor *descriptor_00;
  char *__s;
  Nullable<const_char_*> p;
  char *in_R9;
  csharp *this_01;
  string_view enum_name;
  string_view enum_value_name;
  AlphaNum local_f0;
  AlphaNum local_c0;
  string local_90;
  string local_70;
  AlphaNum local_50;
  
LAB_00b91cb1:
  switch(descriptor->type_) {
  case '\x01':
    f_00 = (descriptor->field_20).default_value_double_;
    if (f_00 < INFINITY) {
      if (-INFINITY < f_00) {
        if (!NAN(f_00)) {
          absl::lts_20250127::AlphaNum::AlphaNum(&local_f0,f_00);
          p = "D";
LAB_00b91d57:
          local_c0.piece_ = absl::lts_20250127::NullSafeStringView(p);
          absl::lts_20250127::StrCat_abi_cxx11_
                    (__return_storage_ptr__,(lts_20250127 *)&local_f0,&local_c0,&local_c0);
          return __return_storage_ptr__;
        }
        __s = "double.NaN";
      }
      else {
        __s = "double.NegativeInfinity";
      }
    }
    else {
      __s = "double.PositiveInfinity";
    }
LAB_00b91ef5:
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,__s,(allocator<char> *)&local_f0);
    return __return_storage_ptr__;
  case '\x02':
    f = (descriptor->field_20).default_value_float_;
    if (INFINITY <= f) {
      __s = "float.PositiveInfinity";
      goto LAB_00b91ef5;
    }
    if (f <= -INFINITY) {
      __s = "float.NegativeInfinity";
      goto LAB_00b91ef5;
    }
    if (!NAN(f)) {
      absl::lts_20250127::AlphaNum::AlphaNum(&local_f0,f);
      p = "F";
      goto LAB_00b91d57;
    }
    __s = "float.NaN";
    goto LAB_00b91ef5;
  case '\x03':
  case '\x10':
  case '\x12':
    absl::lts_20250127::AlphaNum::AlphaNum(&local_f0,(descriptor->field_20).default_value_int64_t_);
    p = "L";
    goto LAB_00b91d57;
  case '\x04':
  case '\x06':
    absl::lts_20250127::AlphaNum::AlphaNum(&local_f0,(descriptor->field_20).default_value_uint64_t_)
    ;
    p = "UL";
    goto LAB_00b91d57;
  case '\x05':
  case '\x0f':
  case '\x11':
    absl::lts_20250127::AlphaNum::AlphaNum(&local_f0,(descriptor->field_20).default_value_int32_t_);
    pAVar4 = extraout_RDX;
    break;
  case '\a':
  case '\r':
    absl::lts_20250127::AlphaNum::AlphaNum(&local_f0,(descriptor->field_20).default_value_uint32_t_)
    ;
    pAVar4 = extraout_RDX_00;
    break;
  case '\b':
    if ((descriptor->field_20).default_value_bool_ == true) {
      __s = "true";
    }
    else {
      __s = "false";
    }
    goto LAB_00b91ef5;
  case '\t':
    GetStringDefaultValueInternal_abi_cxx11_(__return_storage_ptr__,this,descriptor);
    return __return_storage_ptr__;
  case '\n':
  case '\v':
    bVar2 = IsWrapperType(descriptor);
    if (bVar2) goto code_r0x00b91cda;
    __s = "null";
    goto LAB_00b91ef5;
  case '\f':
    GetBytesDefaultValueInternal_abi_cxx11_(__return_storage_ptr__,this,descriptor);
    return __return_storage_ptr__;
  case '\x0e':
    pEVar3 = FieldDescriptor::default_value_enum(descriptor);
    GetClassName_abi_cxx11_(&local_70,(csharp *)pEVar3->type_,descriptor_00);
    local_f0.piece_._M_len = local_70._M_string_length;
    local_f0.piece_._M_str = local_70._M_dataplus._M_p;
    local_c0.piece_ = absl::lts_20250127::NullSafeStringView(".");
    pEVar3 = FieldDescriptor::default_value_enum(descriptor);
    puVar1 = (ushort *)(pEVar3->type_->all_names_).payload_;
    this_01 = (csharp *)(ulong)*puVar1;
    pEVar3 = FieldDescriptor::default_value_enum(descriptor);
    pAVar4 = (AlphaNum *)(pEVar3->all_names_->_M_dataplus)._M_p;
    enum_name._M_str = (char *)pEVar3->all_names_->_M_string_length;
    enum_name._M_len = (long)puVar1 + ~(ulong)this_01;
    enum_value_name._M_str = in_R9;
    enum_value_name._M_len = (size_t)pAVar4;
    GetEnumValueName_abi_cxx11_(&local_90,this_01,enum_name,enum_value_name);
    local_50.piece_._M_len = local_90._M_string_length;
    local_50.piece_._M_str = local_90._M_dataplus._M_p;
    absl::lts_20250127::StrCat_abi_cxx11_
              (__return_storage_ptr__,(lts_20250127 *)&local_f0,&local_c0,&local_50,pAVar4);
    std::__cxx11::string::~string((string *)&local_90);
    std::__cxx11::string::~string((string *)&local_70);
    return __return_storage_ptr__;
  default:
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_f0,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/csharp/csharp_field_base.cc"
               ,0x195);
    absl::lts_20250127::log_internal::LogMessage::operator<<
              ((LogMessage *)&local_f0,(char (*) [20])"Unknown field type.");
    absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
              ((LogMessageFatal *)&local_f0);
  }
  absl::lts_20250127::StrCat_abi_cxx11_(__return_storage_ptr__,(lts_20250127 *)&local_f0,pAVar4);
  return __return_storage_ptr__;
code_r0x00b91cda:
  this_00 = FieldDescriptor::message_type(descriptor);
  this = (FieldGeneratorBase *)0x0;
  descriptor = Descriptor::field(this_00,0);
  goto LAB_00b91cb1;
}

Assistant:

std::string FieldGeneratorBase::default_value(const FieldDescriptor* descriptor) {
  switch (descriptor->type()) {
    case FieldDescriptor::TYPE_ENUM:
      return absl::StrCat(
          GetClassName(descriptor->default_value_enum()->type()), ".",
          GetEnumValueName(descriptor->default_value_enum()->type()->name(),
                           descriptor->default_value_enum()->name()));
    case FieldDescriptor::TYPE_MESSAGE:
    case FieldDescriptor::TYPE_GROUP:
      if (IsWrapperType(descriptor)) {
        const FieldDescriptor* wrapped_field = descriptor->message_type()->field(0);
        return default_value(wrapped_field);
      } else {
        return "null";
      }
    case FieldDescriptor::TYPE_DOUBLE: {
      double value = descriptor->default_value_double();
      if (value == std::numeric_limits<double>::infinity()) {
        return "double.PositiveInfinity";
      } else if (value == -std::numeric_limits<double>::infinity()) {
        return "double.NegativeInfinity";
      } else if (std::isnan(value)) {
        return "double.NaN";
      }
      return absl::StrCat(value, "D");
    }
    case FieldDescriptor::TYPE_FLOAT: {
      float value = descriptor->default_value_float();
      if (value == std::numeric_limits<float>::infinity()) {
        return "float.PositiveInfinity";
      } else if (value == -std::numeric_limits<float>::infinity()) {
        return "float.NegativeInfinity";
      } else if (std::isnan(value)) {
        return "float.NaN";
      }
      return absl::StrCat(value, "F");
    }
    case FieldDescriptor::TYPE_INT64:
      return absl::StrCat(descriptor->default_value_int64(), "L");
    case FieldDescriptor::TYPE_UINT64:
      return absl::StrCat(descriptor->default_value_uint64(), "UL");
    case FieldDescriptor::TYPE_INT32:
      return absl::StrCat(descriptor->default_value_int32());
    case FieldDescriptor::TYPE_FIXED64:
      return absl::StrCat(descriptor->default_value_uint64(), "UL");
    case FieldDescriptor::TYPE_FIXED32:
      return absl::StrCat(descriptor->default_value_uint32());
    case FieldDescriptor::TYPE_BOOL:
      if (descriptor->default_value_bool()) {
        return "true";
      } else {
        return "false";
      }
    case FieldDescriptor::TYPE_STRING:
      return GetStringDefaultValueInternal(descriptor);
    case FieldDescriptor::TYPE_BYTES:
      return GetBytesDefaultValueInternal(descriptor);
    case FieldDescriptor::TYPE_UINT32:
      return absl::StrCat(descriptor->default_value_uint32());
    case FieldDescriptor::TYPE_SFIXED32:
      return absl::StrCat(descriptor->default_value_int32());
    case FieldDescriptor::TYPE_SFIXED64:
      return absl::StrCat(descriptor->default_value_int64(), "L");
    case FieldDescriptor::TYPE_SINT32:
      return absl::StrCat(descriptor->default_value_int32());
    case FieldDescriptor::TYPE_SINT64:
      return absl::StrCat(descriptor->default_value_int64(), "L");
    default:
      ABSL_LOG(FATAL) << "Unknown field type.";
      return "";
  }
}